

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

void mxx::custom_op<char>::custom_function<std::bit_or<char>>
               (char *param_1,int *param_2,MPI_Datatype *param_3,char *param_4)

{
  char cVar1;
  long local_58;
  MPI_Aint true_lb;
  MPI_Aint true_extent;
  char inout_buf;
  char in_buf;
  int *piStack_40;
  int i;
  char *inout;
  char *in;
  MPI_Datatype *dt_local;
  int *len_local;
  void *inoutvec_local;
  void *invec_local;
  
  in = param_4;
  dt_local = param_3;
  len_local = param_2;
  inoutvec_local = param_1;
  if (1 < *(int *)param_3) {
    piStack_40 = param_2;
    inout = param_1;
    for (true_extent._4_4_ = 0; true_extent._4_4_ < *(int *)dt_local + -1;
        true_extent._4_4_ = true_extent._4_4_ + 1) {
      cVar1 = std::bit_or<char>::operator()
                        ((bit_or<char> *)((long)&invec_local + 7),inout + true_extent._4_4_,
                         (char *)((long)piStack_40 + (long)true_extent._4_4_));
      *(char *)((long)piStack_40 + (long)true_extent._4_4_) = cVar1;
    }
  }
  MPI_Type_get_true_extent(*(undefined8 *)in,&local_58,&true_lb);
  memcpy((void *)((long)&true_extent + local_58 + 3),
         (void *)((long)inoutvec_local + (long)(*(int *)dt_local + -1)),true_lb);
  memcpy((void *)((long)&true_extent + local_58 + 2),
         (void *)((long)len_local + (long)(*(int *)dt_local + -1)),true_lb);
  true_extent._2_1_ =
       std::bit_or<char>::operator()
                 ((bit_or<char> *)((long)&invec_local + 7),(char *)((long)&true_extent + 3),
                  (char *)((long)&true_extent + 2));
  memcpy((void *)((long)len_local + (long)(*(int *)dt_local + -1)),
         (void *)((long)&true_extent + local_58 + 2),true_lb);
  return;
}

Assistant:

static void custom_function(Func func, void* invec, void* inoutvec, int* len, MPI_Datatype* dt) {
        if (*len > 1) {
            T* in = (T*) invec;
            T* inout = (T*) inoutvec;
            for (int i = 0; i < *len-1; ++i) {
                inout[i] = func(in[i], inout[i]);
            }
        }
        // only read and write the `true_extent` of the datatype
        // for the last item (otherwise we might encounter a memory error)
        // [see github OpenMPI issue #1462]
        T in_buf;
        T inout_buf;
        MPI_Aint true_extent, true_lb;
        MPI_Type_get_true_extent(*dt, &true_lb, &true_extent);
        std::memcpy((char*)&in_buf+true_lb, (char*)invec+(sizeof(T)*(*len-1)), true_extent);
        std::memcpy((char*)&inout_buf+true_lb, (char*)inoutvec+(sizeof(T)*(*len-1)), true_extent);
        // now do the operation on our local buffers
        inout_buf = func(in_buf, inout_buf);
        // copy the results back, again only to true_extent
        std::memcpy((char*)inoutvec+(sizeof(T)*(*len - 1)), (char*)&inout_buf+true_lb, true_extent);
    }